

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::remove_outer(string *str,char key)

{
  char cVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  char local_11;
  string *psStack_10;
  char key_local;
  string *str_local;
  
  local_11 = key;
  psStack_10 = str;
  uVar3 = ::std::__cxx11::string::length();
  if ((1 < uVar3) && (pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == local_11)) {
    pcVar4 = (char *)::std::__cxx11::string::front();
    cVar1 = *pcVar4;
    pcVar4 = (char *)::std::__cxx11::string::back();
    if (cVar1 == *pcVar4) {
      ::std::__cxx11::string::pop_back();
      psVar2 = psStack_10;
      local_28._M_current = (char *)::std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
      local_40._M_current = (char *)::std::__cxx11::string::begin();
      local_38 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_40,1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
      ::std::__cxx11::string::erase(psVar2,local_20,local_30);
    }
  }
  return psStack_10;
}

Assistant:

CLI11_INLINE std::string &remove_outer(std::string &str, char key) {
    if(str.length() > 1 && (str.front() == key)) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}